

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  uhugeint_t shift;
  uhugeint_t shift_00;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uhugeint_t uVar9;
  uint64_t in_stack_ffffffffffffff68;
  uint64_t uStack_90;
  uhugeint_t local_88;
  uhugeint_t *local_78;
  uhugeint_t *local_70;
  uhugeint_t local_68;
  idx_t local_50;
  ulong local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_78 = ldata;
  local_70 = result_data;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 0;
      do {
        local_88.lower = *(uint64_t *)((long)&rdata->lower + lVar5);
        local_88.upper = *(uint64_t *)((long)&rdata->upper + lVar5);
        puVar1 = (uint64_t *)((long)&local_78->lower + lVar5);
        local_68.lower = *puVar1;
        local_68.upper = puVar1[1];
        uVar9.upper = in_stack_ffffffffffffff68;
        uVar9.lower = 0x10430d5;
        bVar3 = RightShiftInRange<duckdb::uhugeint_t>(uVar9);
        if (bVar3) {
          uVar9 = uhugeint_t::operator>>(&local_68,&local_88);
          in_stack_ffffffffffffff68 = uVar9.lower;
          uStack_90 = uVar9.upper;
        }
        else {
          uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff68,0);
        }
        puVar1 = (uint64_t *)((long)&local_70->lower + lVar5);
        *puVar1 = in_stack_ffffffffffffff68;
        puVar1[1] = uStack_90;
        lVar5 = lVar5 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    local_38 = 0;
    uVar6 = 0;
    local_50 = count;
    local_40 = mask;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar4 = 0xffffffffffffffff;
      }
      else {
        uVar4 = puVar2[local_38];
      }
      uVar8 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar8 = count;
      }
      uVar7 = uVar8;
      if (uVar4 != 0) {
        uVar7 = uVar6;
        if (uVar4 == 0xffffffffffffffff) {
          if (uVar6 < uVar8) {
            lVar5 = uVar6 << 4;
            do {
              local_88.lower = *(uint64_t *)((long)&rdata->lower + lVar5);
              local_88.upper = *(uint64_t *)((long)&rdata->upper + lVar5);
              puVar1 = (uint64_t *)((long)&local_78->lower + lVar5);
              local_68.lower = *puVar1;
              local_68.upper = puVar1[1];
              shift.upper = in_stack_ffffffffffffff68;
              shift.lower = 0x1042f9d;
              bVar3 = RightShiftInRange<duckdb::uhugeint_t>(shift);
              if (bVar3) {
                uVar9 = uhugeint_t::operator>>(&local_68,&local_88);
                in_stack_ffffffffffffff68 = uVar9.lower;
                uStack_90 = uVar9.upper;
              }
              else {
                uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff68,0);
              }
              puVar1 = (uint64_t *)((long)&local_70->lower + lVar5);
              *puVar1 = in_stack_ffffffffffffff68;
              puVar1[1] = uStack_90;
              uVar7 = uVar7 + 1;
              lVar5 = lVar5 + 0x10;
            } while (uVar8 != uVar7);
          }
        }
        else {
          count = local_50;
          if (uVar6 < uVar8) {
            lVar5 = uVar6 << 4;
            uVar7 = 0;
            do {
              if ((uVar4 >> (uVar7 & 0x3f) & 1) != 0) {
                local_88.lower = *(uint64_t *)((long)&rdata->lower + lVar5);
                local_88.upper = *(uint64_t *)((long)&rdata->upper + lVar5);
                puVar1 = (uint64_t *)((long)&local_78->lower + lVar5);
                local_68.lower = *puVar1;
                local_68.upper = puVar1[1];
                shift_00.upper = in_stack_ffffffffffffff68;
                shift_00.lower = 0x104302d;
                bVar3 = RightShiftInRange<duckdb::uhugeint_t>(shift_00);
                if (bVar3) {
                  uVar9 = uhugeint_t::operator>>(&local_68,&local_88);
                  in_stack_ffffffffffffff68 = uVar9.lower;
                  uStack_90 = uVar9.upper;
                }
                else {
                  uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff68,0);
                }
                puVar1 = (uint64_t *)((long)&local_70->lower + lVar5);
                *puVar1 = in_stack_ffffffffffffff68;
                puVar1[1] = uStack_90;
              }
              uVar7 = uVar7 + 1;
              lVar5 = lVar5 + 0x10;
            } while ((uVar6 - uVar8) + uVar7 != 0);
            mask = local_40;
            count = local_50;
            uVar7 = uVar6 + uVar7;
          }
        }
      }
      local_38 = local_38 + 1;
      uVar6 = uVar7;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}